

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O3

int unicode_from_utf8(uint8_t *p,int max_len,uint8_t **pp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  long lVar5;
  ulong uVar6;
  
  puVar4 = p + 1;
  bVar1 = *p;
  uVar3 = (uint)(char)bVar1;
  if ((char)bVar1 < '\0') {
    if (0x3d < (byte)(uVar3 + 0x40)) {
      return -1;
    }
    iVar2 = *(int *)(&DAT_00177cc4 + (ulong)(uVar3 + 0x40 & 0xff) * 4);
    if (max_len <= iVar2) {
      return -1;
    }
    uVar6 = (ulong)(iVar2 - 1);
    uVar3 = (uint)(bVar1 & "\x1f\x0f\a\x03\x01"[uVar6]);
    lVar5 = 0;
    do {
      if (-0x41 < (char)puVar4[lVar5]) {
        return -1;
      }
      uVar3 = puVar4[lVar5] & 0x3f | uVar3 << 6;
      lVar5 = lVar5 + 1;
    } while (iVar2 != (int)lVar5);
    puVar4 = p + uVar6 + 2;
    if (uVar3 < utf8_min_code[uVar6]) {
      return -1;
    }
  }
  *pp = puVar4;
  return uVar3;
}

Assistant:

int unicode_from_utf8(const uint8_t *p, int max_len, const uint8_t **pp)
{
    int l, c, b, i;

    c = *p++;
    if (c < 0x80) {
        *pp = p;
        return c;
    }
    switch(c) {
    case 0xc0: case 0xc1: case 0xc2: case 0xc3:
    case 0xc4: case 0xc5: case 0xc6: case 0xc7:
    case 0xc8: case 0xc9: case 0xca: case 0xcb:
    case 0xcc: case 0xcd: case 0xce: case 0xcf:
    case 0xd0: case 0xd1: case 0xd2: case 0xd3:
    case 0xd4: case 0xd5: case 0xd6: case 0xd7:
    case 0xd8: case 0xd9: case 0xda: case 0xdb:
    case 0xdc: case 0xdd: case 0xde: case 0xdf:
        l = 1;
        break;
    case 0xe0: case 0xe1: case 0xe2: case 0xe3:
    case 0xe4: case 0xe5: case 0xe6: case 0xe7:
    case 0xe8: case 0xe9: case 0xea: case 0xeb:
    case 0xec: case 0xed: case 0xee: case 0xef:
        l = 2;
        break;
    case 0xf0: case 0xf1: case 0xf2: case 0xf3:
    case 0xf4: case 0xf5: case 0xf6: case 0xf7:
        l = 3;
        break;
    case 0xf8: case 0xf9: case 0xfa: case 0xfb:
        l = 4;
        break;
    case 0xfc: case 0xfd:
        l = 5;
        break;
    default:
        return -1;
    }
    /* check that we have enough characters */
    if (l > (max_len - 1))
        return -1;
    c &= utf8_first_code_mask[l - 1];
    for(i = 0; i < l; i++) {
        b = *p++;
        if (b < 0x80 || b >= 0xc0)
            return -1;
        c = (c << 6) | (b & 0x3f);
    }
    if (c < utf8_min_code[l - 1])
        return -1;
    *pp = p;
    return c;
}